

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O0

void __thiscall
supermap::BloomFilter<supermap::Key<128UL>_>::BloomFilter
          (BloomFilter<supermap::Key<128UL>_> *this,BloomFilter<supermap::Key<128UL>_> *other)

{
  Filter<supermap::Key<128UL>_> *pFVar1;
  pointer pHVar2;
  long in_RSI;
  Filter<supermap::Key<128UL>_> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000018;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000020;
  vector<bool,_std::allocator<bool>_> *in_stack_00000088;
  vector<bool,_std::allocator<bool>_> *in_stack_00000090;
  
  Filter<supermap::Key<128UL>_>::Filter(in_RDI);
  (in_RDI->super_Cloneable<supermap::Filter<supermap::Key<128UL>_>_>)._vptr_Cloneable =
       (_func_int **)&PTR_clone_003905d8;
  pFVar1 = in_RDI + 1;
  pHVar2 = std::unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_>::operator->
                     ((unique_ptr<supermap::Hasher,_std::default_delete<supermap::Hasher>_> *)
                      0x287c93);
  (**(pHVar2->super_Cloneable<supermap::Hasher>)._vptr_Cloneable)(pFVar1);
  in_RDI[2].super_Cloneable<supermap::Filter<supermap::Key<128UL>_>_>._vptr_Cloneable =
       *(_func_int ***)(in_RSI + 0x10);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_00000020,in_stack_00000018);
  std::vector<bool,_std::allocator<bool>_>::vector(in_stack_00000090,in_stack_00000088);
  *(byte *)&in_RDI[0xb].super_Cloneable<supermap::Filter<supermap::Key<128UL>_>_>._vptr_Cloneable =
       *(byte *)(in_RSI + 0x58) & 1;
  return;
}

Assistant:

BloomFilter(const BloomFilter &other)
        : hasher_(other.hasher_->clone()),
          sizeMultiplier_(other.sizeMultiplier_),
          seeds_(other.seeds_),
          elements_(other.elements_),
          wasReserved_(other.wasReserved_) {
    }